

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::str_writer<char>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
           *this,align_spec *spec,str_writer<char> *f)

{
  size_t *psVar1;
  undefined1 uVar2;
  ulong uVar3;
  _List_node_base *p_Var4;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar5;
  ulong uVar6;
  ulong uVar7;
  char __tmp;
  char *__last;
  char *__first;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  uVar9 = (ulong)spec->width_;
  uVar3 = f->size_;
  uVar8 = uVar3 - uVar9;
  if (uVar3 < uVar9) {
    uVar2 = (undefined1)spec->fill_;
    uVar7 = uVar9 - uVar3;
    if (spec->align_ == ALIGN_CENTER) {
      uVar6 = uVar7 >> 1;
      bVar5.container = *(list<char,_std::allocator<char>_> **)this;
      uVar8 = uVar6;
      if (1 < uVar7) {
        do {
          p_Var4 = (_List_node_base *)operator_new(0x18);
          *(undefined1 *)&p_Var4[1]._M_next = uVar2;
          std::__detail::_List_node_base::_M_hook(p_Var4);
          psVar1 = &((bVar5.container)->super__List_base<char,_std::allocator<char>_>)._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      *(list<char,_std::allocator<char>_> **)this = bVar5.container;
      bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                        (f->s,f->s + f->size_,bVar5);
      *(list<char,_std::allocator<char>_> **)this = bVar5.container;
      if (uVar7 != uVar6) {
        lVar10 = (uVar3 + uVar6) - uVar9;
        do {
          p_Var4 = (_List_node_base *)operator_new(0x18);
          *(undefined1 *)&p_Var4[1]._M_next = uVar2;
          std::__detail::_List_node_base::_M_hook(p_Var4);
          psVar1 = &((bVar5.container)->super__List_base<char,_std::allocator<char>_>)._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 + 1;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0);
      }
      goto LAB_001d8e6a;
    }
    if (spec->align_ != ALIGN_RIGHT) {
      bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                        (f->s,f->s + uVar3,*(list<char,_std::allocator<char>_> **)this);
      *(list<char,_std::allocator<char>_> **)this = bVar5.container;
      while (uVar7 != 0) {
        p_Var4 = (_List_node_base *)operator_new(0x18);
        *(undefined1 *)&p_Var4[1]._M_next = uVar2;
        std::__detail::_List_node_base::_M_hook(p_Var4);
        psVar1 = &((bVar5.container)->super__List_base<char,_std::allocator<char>_>)._M_impl._M_node
                  ._M_size;
        *psVar1 = *psVar1 + 1;
        uVar8 = uVar8 + 1;
        uVar7 = uVar8;
      }
      goto LAB_001d8e6a;
    }
    bVar5.container = *(list<char,_std::allocator<char>_> **)this;
    if (uVar7 != 0) {
      lVar10 = uVar3 - uVar9;
      do {
        p_Var4 = (_List_node_base *)operator_new(0x18);
        *(undefined1 *)&p_Var4[1]._M_next = uVar2;
        std::__detail::_List_node_base::_M_hook(p_Var4);
        psVar1 = &((bVar5.container)->super__List_base<char,_std::allocator<char>_>)._M_impl._M_node
                  ._M_size;
        *psVar1 = *psVar1 + 1;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0);
    }
    *(list<char,_std::allocator<char>_> **)this = bVar5.container;
    __first = f->s;
    __last = __first + f->size_;
  }
  else {
    __first = f->s;
    __last = __first + uVar3;
    bVar5.container = *(list<char,_std::allocator<char>_> **)this;
  }
  bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    (__first,__last,bVar5);
LAB_001d8e6a:
  *(list<char,_std::allocator<char>_> **)this = bVar5.container;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }